

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Vector3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Vector3f v,Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 auVar7 [64];
  float x;
  Vector3f VVar8;
  Vector3f VVar9;
  Vector3f VVar10;
  Transform t;
  Transform local_88;
  undefined1 auVar6 [16];
  
  auVar7._4_60_ = v._12_60_;
  auVar7._0_4_ = v.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._8_56_ = v._8_56_;
  auVar4._0_8_ = v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6 = auVar7._0_16_;
  auVar3 = auVar4._0_16_;
  if ((this->actuallyAnimated == true) && (this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate(&local_88,this,time);
      auVar6 = vmovshdup_avx(auVar3);
      fVar5 = auVar6._0_4_;
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[0][1])),auVar3,
                               ZEXT416((uint)local_88.m.m[0][0]));
      auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)auVar7._0_4_),ZEXT416((uint)local_88.m.m[0][2]))
      ;
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[1][1])),auVar3,
                               ZEXT416((uint)local_88.m.m[1][0]));
      auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)auVar7._0_4_),ZEXT416((uint)local_88.m.m[1][2]))
      ;
      auVar6 = vinsertps_avx(auVar6,auVar1,0x10);
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[2][1])),auVar3,
                               ZEXT416((uint)local_88.m.m[2][0]));
      auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)auVar7._0_4_),ZEXT416((uint)local_88.m.m[2][2]))
      ;
      VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar6._0_8_;
      VVar8.super_Tuple3<pbrt::Vector3,_float>.z = auVar3._0_4_;
      return (Vector3f)VVar8.super_Tuple3<pbrt::Vector3,_float>;
    }
    auVar1 = vmovshdup_avx(auVar3);
    fVar5 = auVar1._0_4_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->endTransform).m.m[0][1])),auVar3,
                             ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar6,ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->endTransform).m.m[1][1])),auVar3,
                             ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar6,ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar1 = vinsertps_avx(auVar1,auVar2,0x10);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->endTransform).m.m[2][1])),auVar3,
                             ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar3 = vfmadd231ss_fma(auVar3,auVar6,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
    VVar10.super_Tuple3<pbrt::Vector3,_float>.z = auVar3._0_4_;
    return (Vector3f)VVar10.super_Tuple3<pbrt::Vector3,_float>;
  }
  auVar1 = vmovshdup_avx(auVar3);
  fVar5 = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->startTransform).m.m[0][1])),auVar3,
                           ZEXT416((uint)(this->startTransform).m.m[0][0]));
  auVar1 = vfmadd231ss_fma(auVar1,auVar6,ZEXT416((uint)(this->startTransform).m.m[0][2]));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->startTransform).m.m[1][1])),auVar3,
                           ZEXT416((uint)(this->startTransform).m.m[1][0]));
  auVar2 = vfmadd231ss_fma(auVar2,auVar6,ZEXT416((uint)(this->startTransform).m.m[1][2]));
  auVar1 = vinsertps_avx(auVar1,auVar2,0x10);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->startTransform).m.m[2][1])),auVar3,
                           ZEXT416((uint)(this->startTransform).m.m[2][0]));
  auVar3 = vfmadd231ss_fma(auVar3,auVar6,ZEXT416((uint)(this->startTransform).m.m[2][2]));
  VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
  VVar9.super_Tuple3<pbrt::Vector3,_float>.z = auVar3._0_4_;
  return (Vector3f)VVar9.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f AnimatedTransform::operator()(Vector3f v, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(v);
    else if (time >= endTime)
        return endTransform(v);
    Transform t = Interpolate(time);
    return t(v);
}